

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O3

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_GetDevice_Ex
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,char *deviceId,
          IOTHUB_DEVICE_EX *deviceInfo)

{
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  IOTHUB_DEVICE_OR_MODULE local_c0;
  
  if ((deviceId == (char *)0x0 || registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
      deviceInfo == (IOTHUB_DEVICE_EX *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar4 = "Input parameter cannot be NULL";
    IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    iVar3 = 0x65b;
  }
  else {
    if (deviceInfo->version == 1) {
      memset(&local_c0,0,0xa0);
      IVar1 = IoTHubRegistryManager_GetDeviceOrModule
                        (registryManagerHandle,deviceId,(char *)0x0,&local_c0);
      if (IVar1 != IOTHUB_REGISTRYMANAGER_OK) {
        return IVar1;
      }
      move_deviceOrModule_members_to_deviceEx(&local_c0,deviceInfo);
      free(local_c0.moduleId);
      local_c0.moduleId = (char *)0x0;
      free(local_c0.managedBy);
      return IOTHUB_REGISTRYMANAGER_OK;
    }
    p_Var2 = xlogging_get_log_function();
    IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    pcVar4 = "deviceInfo must have a valid version";
    iVar3 = 0x661;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
            ,"IoTHubRegistryManager_GetDevice_Ex",iVar3,1,pcVar4);
  return IVar1;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_GetDevice_Ex(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const char* deviceId, IOTHUB_DEVICE_EX* deviceInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceId == NULL) || (deviceInfo == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if ((deviceInfo->version < IOTHUB_DEVICE_EX_VERSION_1) ||
            (deviceInfo->version > IOTHUB_DEVICE_EX_VERSION_LATEST))
    {
        LogError("deviceInfo must have a valid version");
        result = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    else
    {
        IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;
        memset(&deviceOrModuleInfo, 0, sizeof(deviceOrModuleInfo));

        result = IoTHubRegistryManager_GetDeviceOrModule(registryManagerHandle, deviceId, NULL, &deviceOrModuleInfo);
        if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            move_deviceOrModule_members_to_deviceEx(&deviceOrModuleInfo, deviceInfo);
            free_nonDeviceEx_members_from_deviceOrModule(&deviceOrModuleInfo);
        }
    }

    return result;
}